

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

TagAliasRegistry * Catch::TagAliasRegistry::get(void)

{
  if (get()::instance == '\0') {
    get();
  }
  return &get::instance;
}

Assistant:

TagAliasRegistry& TagAliasRegistry::get() {
        static TagAliasRegistry instance;
        return instance;

    }